

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall
stringToUnits_Parenthesis_Test::~stringToUnits_Parenthesis_Test
          (stringToUnits_Parenthesis_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(stringToUnits, Parenthesis)
{
    EXPECT_EQ(
        precise::W / (precise::hr * precise::lb),
        unit_from_string("W/(hr*lb)"));
    EXPECT_EQ(
        precise::W * precise::mol / (precise::hr * precise::lb),
        unit_from_string("(W*mol)/(hr*lb)"));
    EXPECT_EQ(
        (precise::N * precise::time::yr).pow(2), unit_from_string("(N*yr)^2"));
    EXPECT_EQ(
        (precise::N * precise::time::yr).pow(-2),
        unit_from_string("(N*yr)^-2"));
    EXPECT_EQ(
        (precise::N * precise::time::yr).pow(-2) / precise::currency,
        unit_from_string("(N*yr)^-2/$"));
}